

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::warning<>(ValidationContext *this,IssueWarning *issue)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  basic_string_view<char,_std::char_traits<char>_> s_00;
  format_args args;
  string_view fmt;
  string_view fmt_00;
  undefined1 auVar1 [16];
  underlying_type_t<ktx::ReturnCode> uVar2;
  ValidationReport *extraout_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  ValidationReport *in_stack_fffffffffffffd28;
  ValidationReport *in_stack_fffffffffffffd30;
  ValidationReport *this_00;
  size_t in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  char *pcVar3;
  allocator<char> *in_stack_fffffffffffffd60;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  allocator<char> local_241;
  undefined1 local_240;
  undefined2 local_23e;
  char acStack_218 [32];
  undefined8 local_1f8;
  undefined8 local_1f0;
  allocator<char> local_1d1;
  undefined1 local_1d0;
  undefined2 local_1ce;
  undefined1 auStack_1a8 [32];
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_178 [2];
  undefined8 local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 local_148 [16];
  char *local_138;
  undefined1 *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_118;
  undefined8 *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_e8 [2];
  undefined8 local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  unsigned_long_long in_stack_ffffffffffffff98;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t sVar4;
  
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_240 = *in_RSI;
    local_23e = *(undefined2 *)(in_RSI + 2);
    __a = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,__a);
    pcVar3 = acStack_218;
    s_00._M_str = pcVar3;
    s_00._M_len = in_stack_fffffffffffffd38;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffd30,s_00);
    local_130 = local_148;
    local_138 = pcVar3;
    local_178[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_110 = &local_168;
    local_118 = local_178;
    local_100 = 0;
    local_168 = 0;
    fmt_00.size_ = in_stack_ffffffffffffffb0;
    fmt_00.data_ = in_stack_ffffffffffffffa8;
    args.field_1.values_ = in_stack_ffffffffffffffa0.values_;
    args.desc_ = in_stack_ffffffffffffff98;
    this_00 = extraout_RDX;
    local_108 = local_118;
    local_f8 = local_110;
    local_f0 = local_118;
    local_160 = local_118;
    ::fmt::v10::vformat_abi_cxx11_(fmt_00,args);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)this_00,in_stack_fffffffffffffd28);
    ValidationReport::~ValidationReport(this_00);
    std::allocator<char>::~allocator(&local_241);
  }
  else {
    local_188 = in_RSI;
    uVar2 = ktx::operator+(SUCCESS);
    *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar2;
    local_1d0 = 1;
    local_1ce = *(undefined2 *)(local_188 + 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    sVar4 = *(size_t *)(local_188 + 0x18);
    s._M_str = in_stack_fffffffffffffd40;
    s._M_len = in_stack_fffffffffffffd38;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffd30,s);
    local_b8 = local_1f8;
    uStack_b0 = local_1f0;
    local_a0 = &local_b8;
    local_a8 = auStack_1a8;
    local_e8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_78 = &local_d8;
    local_80 = local_e8;
    local_d8 = 0;
    fmt.size_ = sVar4;
    fmt.data_ = (char *)local_80;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_78;
    local_70 = local_80;
    local_d0 = local_80;
    ::fmt::v10::vformat_abi_cxx11_(fmt,(format_args)(auVar1 << 0x40));
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    ValidationReport::~ValidationReport(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(&local_1d1);
  }
  return;
}

Assistant:

void warning(const IssueWarning& issue, Args&&... args) {
        ++numWarning;
        if (treatWarningsAsError) {
            returnCode = +rc::INVALID_FILE;
            callback(ValidationReport{IssueType::error, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});

        } else {
            callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
        }
    }